

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Triangle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Triangle *this,Ray *ray,
          Float tMax)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar4;
  int triIndex;
  TriangleMesh *mesh;
  int *piVar8;
  Point3f *pPVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  Point3f p1;
  Point3f p0;
  Point3f p2;
  optional<pbrt::TriangleIntersection> triIsect;
  SurfaceInteraction intr;
  optional<pbrt::TriangleIntersection> local_144;
  Tuple3<pbrt::Vector3,_float> local_130;
  SurfaceInteraction local_120;
  
  *(long *)(in_FS_OFFSET + -0x3d0) = *(long *)(in_FS_OFFSET + -0x3d0) + 1;
  triIndex = this->triIndex;
  lVar10 = (long)triIndex;
  mesh = *(TriangleMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  piVar8 = mesh->vertexIndices;
  pPVar9 = mesh->p;
  uVar1 = pPVar9[piVar8[lVar10 * 3]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = pPVar9[piVar8[lVar10 * 3]].super_Tuple3<pbrt::Point3,_float>.y;
  p0.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar5;
  p0.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar1;
  uVar2 = pPVar9[piVar8[lVar10 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = pPVar9[piVar8[lVar10 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  p1.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar6;
  p1.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
  uVar3 = pPVar9[piVar8[lVar10 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = pPVar9[piVar8[lVar10 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  p2.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar7;
  p2.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar3;
  p1.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar9[piVar8[lVar10 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  p0.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar9[piVar8[lVar10 * 3]].super_Tuple3<pbrt::Point3,_float>.z;
  p2.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar9[piVar8[lVar10 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  IntersectTriangle(&local_144,ray,tMax,p0,p1,p2);
  if (local_144.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    uVar4._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar4._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar11._0_8_ = uVar4 ^ 0x8000000080000000;
    auVar11._8_4_ = 0x80000000;
    auVar11._12_4_ = 0x80000000;
    local_130.z = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    local_130._0_8_ = vmovlps_avx(auVar11);
    InteractionFromIntersection
              (&local_120,mesh,triIndex,(TriangleIntersection *)&local_144,ray->time,
               (Vector3f *)&local_130);
    *(long *)(in_FS_OFFSET + -0x3c8) = *(long *)(in_FS_OFFSET + -0x3c8) + 1;
    if (local_144.set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         local_120.super_Interaction._24_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
         local_120.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
         local_120.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         local_120.super_Interaction._48_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
         local_120.super_Interaction._56_8_;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) =
         local_120.super_Interaction.mediumInterface;
    ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      *)((long)&__return_storage_ptr__->optionalValue + 0x48))->bits =
         (uintptr_t)
         local_120.super_Interaction.medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
         local_120.dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_120._88_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         local_120.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
         local_120.dndu.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_120._112_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
         local_120.dndv.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_120.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_120.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_120.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_120.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
         local_120.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
         local_120.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_120.shading._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
         local_120.shading.dndu.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
         local_120.shading.dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_120._184_8_;
    ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      *)((long)&__return_storage_ptr__->optionalValue + 0xc0))->bits =
         (uintptr_t)
         local_120.material.
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      *)((long)&__return_storage_ptr__->optionalValue + 200))->bits =
         (uintptr_t)
         local_120.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_120._240_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
         local_120.dpdx.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_120._216_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
         local_120.dpdy.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_120._232_8_;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
         local_144.optionalValue._12_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> Triangle::Intersect(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> triIsect =
        IntersectTriangle(ray, tMax, p0, p1, p2);
    if (!triIsect)
        return {};
    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, triIndex, *triIsect, ray.time, -ray.d);
#ifndef PBRT_IS_GPU_CODE
    ++nTriHits;
#endif
    return ShapeIntersection{intr, triIsect->t};
}